

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,JoinerType args,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<ot::commissioner::Error> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  local_50;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  holder;
  ArgumentTuple tuple;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  FunctionMocker<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pFStack_18;
  JoinerType args_local;
  FunctionMocker<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  args_local_1._4_4_ = args;
  pFStack_18 = this;
  this_local = (FunctionMocker<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)__return_storage_ptr__;
  std::
  tuple<ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::
  tuple<ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
            ((tuple<ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&holder,(JoinerType *)((long)&args_local_1 + 4),args_1,args_2);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (tuple<ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<ot::commissioner::Error>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
              *)&local_50,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
            ::operator->(&local_50);
  ActionResultHolder<ot::commissioner::Error>::Unwrap(__return_storage_ptr__,this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  ::~unique_ptr(&local_50);
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }